

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensusProblem.hpp
# Opt level: O1

void __thiscall
opengv::sac::SampleConsensusProblem<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::selectWithinDistance
          (SampleConsensusProblem<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this,
          model_t *model_coefficients,double threshold,vector<int,_std::allocator<int>_> *inliers)

{
  element_type *peVar1;
  pointer piVar2;
  iterator __position;
  int *__args;
  ulong uVar3;
  long lVar4;
  vector<double,_std::allocator<double>_> dist;
  vector<double,_std::allocator<double>_> local_48;
  double local_28;
  
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  peVar1 = (this->indices_).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_28 = threshold;
  std::vector<double,_std::allocator<double>_>::reserve
            (&local_48,
             (long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  (*this->_vptr_SampleConsensusProblem[8])(this,model_coefficients,&local_48);
  piVar2 = (inliers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((inliers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (inliers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  peVar1 = (this->indices_).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::vector<int,_std::allocator<int>_>::reserve
            (inliers,(long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start >> 2);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3] < local_28) {
        __args = (int *)((long)(((this->indices_).
                                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar4);
        __position._M_current =
             (inliers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (inliers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)inliers,__position,__args);
        }
        else {
          *__position._M_current = *__args;
          (inliers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 4;
    } while (uVar3 < (ulong)((long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
opengv::sac::SampleConsensusProblem<M>::selectWithinDistance(
    const model_t & model_coefficients,
    const double threshold,
    std::vector<int> &inliers )
{
  std::vector<double> dist;
  dist.reserve(indices_->size());
  getDistancesToModel( model_coefficients, dist );

  inliers.clear();
  inliers.reserve(indices_->size());
  for( size_t i = 0; i < dist.size(); ++i )
  {
    if( dist[i] < threshold )
      inliers.push_back( (*indices_)[i] );
  }
}